

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

Value * Kvm::addProc(Kvm *vm,Value *args)

{
  long lVar1;
  
  lVar1 = 0;
  for (; args != vm->NIL; args = *(Value **)&args[1].type_) {
    lVar1 = lVar1 + ((long)args[1]._vptr_Value >> 1);
  }
  return (Value *)(lVar1 * 2 + 1);
}

Assistant:

const Value* Kvm::addProc(Kvm *vm, const Value *args)
{
    long result {0};
    
    while (args != vm->NIL)
    {
        result += TK_INT(car(args));
        args = cdr(args);
    }
    return vm->makeFixnum(result);
}